

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O2

int Abc_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  undefined8 *puVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  word *pwVar7;
  uint uVar8;
  char *pcVar9;
  int Count;
  uint uVar10;
  int i;
  byte bVar11;
  uint uVar12;
  char *pcVar13;
  
  puVar1 = (undefined8 *)pAbc->pAbcPla;
  bVar2 = false;
  Extra_UtilGetoptReset();
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  while( true ) {
    while (iVar6 = Extra_UtilGetopt(argc,argv,"madvh"), iVar6 == 0x76) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (iVar6 == -1) break;
    if (iVar6 == 0x61) {
      bVar4 = (bool)(bVar4 ^ 1);
    }
    else if (iVar6 == 100) {
      bVar5 = (bool)(bVar5 ^ 1);
    }
    else {
      if (iVar6 != 0x6d) {
        Abc_Print(-2,"usage: |ps [-madvh]\n");
        Abc_Print(-2,"\t         prints statistics\n");
        pcVar13 = "yes";
        pcVar9 = "yes";
        if (!bVar2) {
          pcVar9 = "no";
        }
        Abc_Print(-2,"\t-m     : toggle printing multipliers [default = %s]\n",pcVar9);
        pcVar9 = "yes";
        if (!bVar4) {
          pcVar9 = "no";
        }
        Abc_Print(-2,"\t-a     : toggle printing adders [default = %s]\n",pcVar9);
        pcVar9 = "yes";
        if (!bVar5) {
          pcVar9 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle printing distrubition [default = %s]\n",pcVar9);
        if (!bVar3) {
          pcVar13 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar13);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      bVar2 = (bool)(bVar2 ^ 1);
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    printf("%-16s :  ",*puVar1);
    printf("In =%4d  ",(ulong)*(uint *)((long)puVar1 + 0x14));
    printf("Out =%4d  ",(ulong)*(uint *)(puVar1 + 3));
    printf("Cube =%8d  ",(ulong)*(uint *)((long)puVar1 + 0x2c));
    uVar10 = 0;
    for (iVar6 = 0; iVar6 < *(int *)((long)puVar1 + 0x2c); iVar6 = iVar6 + 1) {
      pwVar7 = Vec_WrdEntryP((Vec_Wrd_t *)(puVar1 + 9),*(int *)((long)puVar1 + 0x1c) * iVar6);
      bVar11 = 0;
      uVar8 = *(uint *)((long)puVar1 + 0x14);
      if ((int)*(uint *)((long)puVar1 + 0x14) < 1) {
        uVar8 = 0;
      }
      for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
        uVar10 = (uVar10 + 1) - (uint)((pwVar7[uVar12 >> 5] >> (bVar11 & 0x3e) & 3) == 0);
        bVar11 = bVar11 + 2;
      }
    }
    printf("LitIn =%8d  ",(ulong)uVar10);
    uVar10 = 0;
    for (iVar6 = 0; iVar6 < *(int *)((long)puVar1 + 0x2c); iVar6 = iVar6 + 1) {
      pwVar7 = Vec_WrdEntryP((Vec_Wrd_t *)(puVar1 + 0xb),*(int *)(puVar1 + 4) * iVar6);
      bVar11 = 0;
      uVar8 = *(uint *)(puVar1 + 3);
      if ((int)*(uint *)(puVar1 + 3) < 1) {
        uVar8 = 0;
      }
      for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
        uVar10 = uVar10 + (((uint)(pwVar7[uVar12 >> 5] >> (bVar11 & 0x3e)) & 3) == 2);
        bVar11 = bVar11 + 2;
      }
    }
    printf("LitOut =%8d  ",(ulong)uVar10);
    printf("Div =%6d  ",(ulong)*(uint *)((long)puVar1 + 0x8c));
    putchar(10);
    return 0;
  }
  Abc_Print(1,"Abc_CommandPs(): There is no current design.\n");
  return 0;
}

Assistant:

int Abc_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int fShowCones   = 0;
    int fShowMulti   = 0;
    int fShowAdder   = 0;
    int fShowMem     = 0;
    int fDistrib     = 0;
    int fTwoSides    = 0;
    int fAllObjects  = 0;
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cbamdtovh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fShowCones ^= 1;
            break;
        case 'b':
            fShowMulti ^= 1;
            break;
        case 'a':
            fShowAdder ^= 1;
            break;
        case 'm':
            fShowMem ^= 1;
            break;
        case 'd':
            fDistrib ^= 1;
            break;
        case 't':
            fTwoSides ^= 1;
            break;
        case 'o':
            fAllObjects ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkPrintStats( pNtk, fDistrib, fTwoSides, fVerbose );
    if ( fShowCones )
        Wlc_NtkProfileCones( pNtk ); 
    if ( fShowMulti )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_MULTI );
    if ( fShowAdder )
        Wlc_NtkPrintNodes( pNtk, WLC_OBJ_ARI_ADD );
    if ( fShowMem )
        Wlc_NtkPrintMemory( pNtk );
    if ( fAllObjects )
        Wlc_NtkPrintObjects( pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%ps [-cbamdtovh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-c     : toggle printing cones [default = %s]\n",                 fShowCones? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle printing multipliers [default = %s]\n",           fShowMulti? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle printing adders [default = %s]\n",                fShowAdder? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle printing memories [default = %s]\n",              fShowMem?   "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing distrubition [default = %s]\n",          fDistrib?   "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle printing stats for LHS and RHS [default = %s]\n", fTwoSides?  "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle printing all objects [default = %s]\n",           fAllObjects?"yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",   fVerbose?   "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}